

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O3

void swap_drawstring(char *str,guint8 *im,size_t w,size_t h)

{
  int iVar1;
  undefined4 uVar2;
  uint w_00;
  bmap_t *bm;
  guint8 *buf;
  guint8 gVar3;
  int bord;
  guint8 *pgVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint h_00;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  undefined1 auVar13 [12];
  FT_Face_conflict face;
  FT_Library lib;
  long local_a8;
  FT_Bitmap *local_a0;
  long local_98;
  long local_90;
  long local_88;
  int local_7c;
  ulong local_78;
  long local_70;
  long local_68;
  guint8 *local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  long local_40;
  size_t local_38;
  
  uVar6 = 8;
  if (8 < h >> 6) {
    uVar6 = h >> 6;
  }
  uVar11 = (h >> 5) + 3;
  uVar5 = 0x14;
  if (0x21f < h) {
    uVar5 = uVar11 & 0xfffffffc;
  }
  uVar10 = 0x10;
  if (h < 0x440) {
    uVar10 = uVar6 & 0xffffffff;
  }
  if ((str != (char *)0x0) && (local_60 = im, iVar1 = FT_Init_FreeType(&local_58), iVar1 == 0)) {
    iVar1 = FT_New_Face(local_58,"/usr/local/lib/data/DroidSans-Bold.ttf",0,&local_a8);
    if (iVar1 == 0) {
      if (0x20 < (uVar11 & 0xfffffffffffffffc)) {
        uVar5 = 0x20;
      }
      iVar1 = FT_Set_Pixel_Sizes(local_a8,0,uVar5);
      if (iVar1 == 0) {
        local_68 = *(long *)(local_a8 + 0x98);
        local_38 = strlen(str);
        if (local_38 != 0) {
          local_70 = (long)(int)h;
          local_48 = (long)(((int)h - (int)uVar10) + -3);
          sVar12 = 0;
          do {
            uVar2 = FT_Get_Char_Index(local_a8,(long)str[sVar12]);
            iVar1 = FT_Load_Glyph(local_a8,uVar2,0);
            if ((iVar1 == 0) && (iVar1 = FT_Get_Glyph(local_68,&local_90), iVar1 == 0)) {
              local_88 = local_90;
              iVar1 = FT_Glyph_To_Bitmap(&local_88,1,0,0);
              iVar9 = (int)uVar10;
              if (iVar1 == 0) {
                if ((*(char *)(local_88 + 0x4a) == '\x02') && (*(short *)(local_88 + 0x48) == 0x100)
                   ) {
                  local_a0 = (FT_Bitmap *)(local_88 + 0x30);
                  iVar1 = *(int *)(local_88 + 0x28);
                  local_98 = (long)*(int *)(local_88 + 0x2c);
                  w_00 = *(int *)(local_88 + 0x34) + 4;
                  h_00 = *(int *)(local_88 + 0x30) + 4;
                  bm = (bmap_t *)g_malloc(0x10);
                  auVar13 = g_malloc((long)(int)(h_00 * w_00));
                  buf = auVar13._0_8_;
                  bm->b = buf;
                  bm->w = w_00;
                  bm->h = h_00;
                  ft2bmap(local_a0,bm,auVar13._8_4_);
                  blur(buf,w_00,h_00);
                  blur(buf,w_00,h_00);
                  if ((int)h_00 < 1) {
                    ft2bmap(local_a0,bm,bord);
                    blur(buf,w_00,h_00);
                  }
                  else {
                    local_7c = iVar1 + iVar9 + -1;
                    local_50 = local_48 - local_98;
                    local_98 = local_50 + 1;
                    local_40 = (long)(iVar1 + iVar9);
                    local_78 = (ulong)w_00;
                    pgVar4 = local_60 + w * local_98;
                    iVar1 = 0;
                    uVar6 = 0;
                    do {
                      if (-1 < (long)(uVar6 + local_98)) {
                        if (local_70 <= (long)(uVar6 + local_98)) break;
                        lVar7 = local_40;
                        uVar5 = local_78;
                        iVar8 = iVar1;
                        if (0 < (int)w_00) {
                          do {
                            if (-1 < lVar7) {
                              if ((int)w <= lVar7) break;
                              gVar3 = (guint8)((uint)pgVar4[lVar7] - (uint)buf[iVar8]);
                              if ((int)((uint)pgVar4[lVar7] - (uint)buf[iVar8]) < 1) {
                                gVar3 = '\0';
                              }
                              pgVar4[lVar7] = gVar3;
                            }
                            uVar5 = uVar5 - 1;
                            lVar7 = lVar7 + 1;
                            iVar8 = iVar8 + 1;
                          } while (uVar5 != 0);
                        }
                      }
                      uVar6 = uVar6 + 1;
                      iVar1 = iVar1 + w_00;
                      pgVar4 = pgVar4 + w;
                    } while (uVar6 != h_00);
                    ft2bmap(local_a0,bm,(int)pgVar4);
                    blur(buf,w_00,h_00);
                    pgVar4 = local_60 + w * (long)(int)local_50;
                    iVar1 = 0;
                    uVar6 = 0;
                    do {
                      lVar7 = uVar6 + (long)(int)local_50;
                      if (-1 < lVar7) {
                        if (local_70 <= lVar7) break;
                        lVar7 = (long)local_7c;
                        uVar5 = local_78;
                        iVar8 = iVar1;
                        if (0 < (int)w_00) {
                          do {
                            if (-1 < lVar7) {
                              if ((int)w <= lVar7) break;
                              gVar3 = (guint8)((uint)pgVar4[lVar7] + (uint)buf[iVar8]);
                              if (0xfe < (uint)pgVar4[lVar7] + (uint)buf[iVar8]) {
                                gVar3 = 0xff;
                              }
                              pgVar4[lVar7] = gVar3;
                            }
                            uVar5 = uVar5 - 1;
                            lVar7 = lVar7 + 1;
                            iVar8 = iVar8 + 1;
                          } while (uVar5 != 0);
                        }
                      }
                      uVar6 = uVar6 + 1;
                      iVar1 = iVar1 + w_00;
                      pgVar4 = pgVar4 + w;
                    } while (uVar6 != h_00);
                  }
                  g_free(buf);
                  g_free(bm);
                  FT_Done_Glyph(local_88);
                }
                else {
                  FT_Done_Glyph();
                }
              }
              uVar10 = (ulong)(uint)(iVar9 + (int)(*(ulong *)(local_68 + 0x80) >> 6));
              FT_Done_Glyph(local_90);
            }
            sVar12 = sVar12 + 1;
          } while (sVar12 != local_38);
        }
      }
    }
    FT_Done_FreeType(local_58);
  }
  return;
}

Assistant:

void swap_drawstring(const char *str, guint8 *im, size_t w, size_t h) {
    size_t fs = ROUND_UPTO(h / 32, 4);
    size_t bd = CLAMP(h / 64, 8, 16);
    draw_string(P2SC_FONT_DROIDBOLD, CLAMP(fs, 20, 32), str, bd, h - 3 - bd, im, w, h);
}